

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sleeplock.cpp
# Opt level: O0

bool __thiscall
ON_SleepLock::GetLock
          (ON_SleepLock *this,uint interval_wait_msecs,uint max_wait_msecs,
          bool bStealLockAfterWaiting)

{
  bool bVar1;
  duration<long,_std::ratio<1L,_1000L>_> local_30;
  byte local_21;
  uint local_20;
  uint uStack_1c;
  bool bStealLockAfterWaiting_local;
  uint max_wait_msecs_local;
  uint interval_wait_msecs_local;
  ON_SleepLock *this_local;
  
  local_21 = bStealLockAfterWaiting;
  local_20 = max_wait_msecs;
  uStack_1c = interval_wait_msecs;
  _max_wait_msecs_local = this;
  bVar1 = GetLockOrReturnFalse(this);
  if (!bVar1) {
    if (uStack_1c == 0) {
      uStack_1c = 0x32;
    }
    while( true ) {
      std::chrono::duration<long,std::ratio<1l,1000l>>::duration<unsigned_int,void>
                ((duration<long,std::ratio<1l,1000l>> *)&local_30,&stack0xffffffffffffffe4);
      std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_30);
      bVar1 = GetLockOrReturnFalse(this);
      if (bVar1) break;
      if (local_20 != 0) {
        if (local_20 <= uStack_1c) {
          if ((local_21 & 1) == 0) {
            return false;
          }
          ON_WarningEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_sleeplock.cpp"
                       ,0x9b,"","Stealing a resource lock.");
          GetLockOrReturnFalse(this);
          return true;
        }
        local_20 = local_20 - uStack_1c;
      }
    }
  }
  return true;
}

Assistant:

bool ON_SleepLock::GetLock( 
  unsigned int interval_wait_msecs,
  unsigned int max_wait_msecs,
  bool bStealLockAfterWaiting
  )
{
  // int locked = ON_IntSleepLock_Test(m_locked,0,1)
  // performs the following test and assignment in
  // an atomic operation.
  //
  // int locked = m_locked;
  // if ( 0 == locked )
  //   m_locked = 1;
  if ( GetLockOrReturnFalse() )
    return true; // acquired lock

  if ( interval_wait_msecs <= 0 )
    interval_wait_msecs = ON_SleepLock::DefaultWaitInterval;

  for(;;)
  {
    // Something else currently has this lock.

    // ON_PointerSleepLock_SuspendThisThread() suspends the thread
    // (not the process) for the specified number of milliseconds.
#if defined(ON_SLEEPLOCK_USES_STD_ATOMIC_FLAG)
    std::this_thread::sleep_for(std::chrono::milliseconds(interval_wait_msecs));
#else
    // Windows - sleep the thread (not the process)
    ::Sleep(interval_wait_msecs);
#endif

    // locked = ON_IntSleepLock_Test(m_locked,0,1)
    // performs the following test and assignment in
    // an atomic operation.
    //
    // locked = m_locked;
    // if ( 0 == locked )
    //   m_locked = 1;
    if ( GetLockOrReturnFalse() )
      return true; // acquired lock
    
    if ( max_wait_msecs > 0 )
    {
      if ( interval_wait_msecs >= max_wait_msecs )
      {
        if (bStealLockAfterWaiting)
        {
          // If the caller set max_wait_msecs to a value that is too small, 
          // has a bug in their code, then this is a bad idea, 
          // but it's also their own fault.
          //
          // If the resource is locked because another thread locked it and 
          // then forgot to unlock it or terminated before it could be unlocked,
          // then this is a good thing because it gets this thread unblocked 
          // and back in business.
          //
          ON_WARNING("Stealing a resource lock.");
          GetLockOrReturnFalse();
          return true;
        }

        // Give up and return false.
        break;
      }
      max_wait_msecs -= interval_wait_msecs;
    }
  }

  return false;  
}